

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::buildTargets((anonymous_namespace)::BuildContext&,std::vector<std::__cxx11::
string,std::allocator<std::__cxx11::string>>const&)::TargetsTask::inputsAvailable(llbuild::core::
TaskInterface_(void *this,TaskInterface ti)

{
  TaskInterface local_a0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  BuildValue local_78;
  
  local_a0.ctx = ti.ctx;
  local_a0.impl = ti.impl;
  local_78.valueData._65_7_ = 0;
  local_78.valueData._72_8_ = 0;
  local_78.valueData._49_8_ = 0;
  local_78.valueData._57_7_ = 0;
  local_78.valueData.asOutputInfo.checksum.bytes[0x10] = '\0';
  local_78.kind = SuccessfulCommand;
  local_78.numOutputInfos = 1;
  local_78.commandHash.value = 0;
  local_78.valueData.asOutputInfo.device = 0;
  local_78.valueData.asOutputInfo.inode = 0;
  local_78.valueData.asOutputInfo.mode = 0;
  local_78.valueData.asOutputInfo.size = 0;
  local_78.valueData.asOutputInfo.modTime.seconds = 0;
  local_78.valueData.asOutputInfo.modTime.nanoseconds = 0;
  local_78.valueData.asOutputInfo.checksum.bytes[0] = '\0';
  anon_unknown.dwarf_988a7::BuildValue::toValue((ValueType *)&local_90,&local_78);
  llbuild::core::TaskInterface::complete(&local_a0,(ValueType *)&local_90,false);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_90);
  anon_unknown.dwarf_988a7::BuildValue::~BuildValue(&local_78);
  return;
}

Assistant:

virtual void inputsAvailable(core::TaskInterface ti) override {
      // Complete the job.
      ti.complete(
        BuildValue::makeSuccessfulCommand({}, CommandSignature()).toValue());
      return;
    }